

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O2

String * __thiscall stick::ArgumentParser::help(String *__return_storage_ptr__,ArgumentParser *this)

{
  Allocator *pAVar1;
  long lVar2;
  String *pSVar3;
  String local_d8;
  String local_b8;
  String local_98;
  String local_78;
  String local_58;
  ArgumentParser *local_38;
  
  usage(__return_storage_ptr__,this);
  if ((this->m_info).m_length != 0) {
    String::String(&local_d8,&this->m_info);
    String::append<char_const*,stick::String,char_const*>(__return_storage_ptr__,"\n",&local_d8);
    String::deallocate(&local_d8);
  }
  if ((this->m_args).m_count != 0) {
    if (this->m_requiredCount != 0) {
      String::append(__return_storage_ptr__,"\nRequired arguments:\n");
      pSVar3 = (String *)((long)(this->m_args).m_data.ptr + 0x48);
      local_38 = this;
      for (lVar2 = (this->m_args).m_count * 0x90; lVar2 != 0; lVar2 = lVar2 + -0x90) {
        if (*(char *)&pSVar3[-1].m_allocator == '\0') {
          if (pSVar3[-2].m_cStr != (char *)0x0) {
            String::append(__return_storage_ptr__,(String *)&pSVar3[-3].m_allocator);
          }
          if (pSVar3[-1].m_cStr != (char *)0x0) {
            if (pSVar3[-2].m_cStr != (char *)0x0) {
              String::append(__return_storage_ptr__,", ");
            }
            String::append(__return_storage_ptr__,(String *)&pSVar3[-2].m_allocator);
          }
          detail::argumentSignature(&local_78,(Argument *)&pSVar3[-3].m_allocator);
          if (pSVar3->m_length == 0) {
            pAVar1 = defaultAllocator();
            String::String(&local_b8,"",pAVar1);
          }
          else {
            String::String(&local_b8,pSVar3);
          }
          String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                    (__return_storage_ptr__," ",&local_78,"    ",&local_b8,"\n");
          String::deallocate(&local_b8);
          String::deallocate(&local_78);
        }
        pSVar3 = (String *)&pSVar3[4].m_capacity;
      }
      String::append(__return_storage_ptr__,"\n");
      this = local_38;
      if ((local_38->m_args).m_count <= local_38->m_requiredCount) {
        return __return_storage_ptr__;
      }
    }
    String::append(__return_storage_ptr__,"Optional arguments:\n");
    pSVar3 = (String *)((long)(this->m_args).m_data.ptr + 0x48);
    for (lVar2 = (this->m_args).m_count * 0x90; lVar2 != 0; lVar2 = lVar2 + -0x90) {
      if (*(char *)&pSVar3[-1].m_allocator == '\x01') {
        if (pSVar3[-2].m_cStr != (char *)0x0) {
          String::append(__return_storage_ptr__,(String *)&pSVar3[-3].m_allocator);
        }
        if (pSVar3[-1].m_cStr != (char *)0x0) {
          if (pSVar3[-2].m_cStr != (char *)0x0) {
            String::append(__return_storage_ptr__,", ");
          }
          String::append(__return_storage_ptr__,(String *)&pSVar3[-2].m_allocator);
        }
        detail::argumentSignature(&local_58,(Argument *)&pSVar3[-3].m_allocator);
        if (pSVar3->m_length == 0) {
          pAVar1 = defaultAllocator();
          String::String(&local_98,"",pAVar1);
        }
        else {
          String::String(&local_98,pSVar3);
        }
        String::append<char_const*,stick::String,char_const*,stick::String,char_const*>
                  (__return_storage_ptr__," ",&local_58,"    ",&local_98,"\n");
        String::deallocate(&local_98);
        String::deallocate(&local_58);
      }
      pSVar3 = (String *)&pSVar3[4].m_capacity;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String ArgumentParser::help() const
{
    String ret = usage();

    if (m_info.length())
        ret.append(AppendVariadicFlag(), "\n", m_info, "\n");

    if (m_args.count())
    {
        if (m_requiredCount)
        {
            ret.append("\nRequired arguments:\n");
            for (auto & arg : m_args)
            {
                if (!arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
            ret.append("\n");
        }
        if (m_args.count() > m_requiredCount)
        {
            ret.append("Optional arguments:\n");
            for (auto & arg : m_args)
            {
                if (arg.bOptional)
                {
                    if (arg.shortName.length())
                        ret.append(arg.shortName);
                    if (arg.name.length())
                    {
                        if (arg.shortName.length())
                            ret.append(", ");
                        ret.append(arg.name);
                    }
                    ret.append(AppendVariadicFlag(),
                               " ",
                               detail::argumentSignature(arg),
                               "    ",
                               arg.info.length() ? arg.info : "",
                               "\n");
                }
            }
        }
    }

    return ret;
}